

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
TOIDecPOMDPDiscrete::TOIDecPOMDPDiscrete
          (TOIDecPOMDPDiscrete *this,string *name,string *descr,string *pf,bool cacheFlatModels)

{
  undefined8 *in_RDI;
  DecPOMDPDiscreteInterface *this_00;
  bool in_stack_0000005f;
  string *in_stack_00000060;
  string *in_stack_00000068;
  string *in_stack_00000070;
  void **in_stack_00000078;
  TransitionObservationIndependentMADPDiscrete *in_stack_00000080;
  
  this_00 = (DecPOMDPDiscreteInterface *)(in_RDI + 0x57);
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)this_00);
  POSGInterface::POSGInterface((POSGInterface *)this_00,&PTR_PTR_00d37bb0);
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)this_00,&PTR_PTR_00d37b98);
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            ((MultiAgentDecisionProcessDiscreteInterface *)(in_RDI + 0x58),
             &PTR_construction_vtable_384__00d37bc0);
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            (this_00,&PTR_construction_vtable_232__00d37b70);
  TransitionObservationIndependentMADPDiscrete::TransitionObservationIndependentMADPDiscrete
            (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
             in_stack_00000060,in_stack_0000005f);
  DecPOMDP::DecPOMDP((DecPOMDP *)(in_RDI + 0x50),&PTR_construction_vtable_176__00d37b20);
  *in_RDI = 0xd37340;
  in_RDI[0x57] = 0xd37720;
  in_RDI[0x57] = 0xd37720;
  in_RDI[0x57] = 0xd37720;
  in_RDI[0x57] = 0xd37720;
  in_RDI[0x58] = 0xd37978;
  in_RDI[0x50] = 0xd37598;
  std::vector<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>::vector
            ((vector<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_> *)0xac5882);
  *(undefined1 *)((long)in_RDI + 0x294) = 0;
  in_RDI[0x53] = 0;
  return;
}

Assistant:

TOIDecPOMDPDiscrete::
TOIDecPOMDPDiscrete(
    const string &name, const string &descr, const string &pf, 
    bool cacheFlatModels) :
    TransitionObservationIndependentMADPDiscrete(name, descr, pf, 
                                                 cacheFlatModels)
{
    _m_initialized = false;
    _m_p_rModel = 0;
}